

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_flat_hash_map_test.cc
# Opt level: O0

void __thiscall
ParallelFlatHashMap_ConcurrencyCheck_Test::~ParallelFlatHashMap_ConcurrencyCheck_Test
          (ParallelFlatHashMap_ConcurrencyCheck_Test *this)

{
  ParallelFlatHashMap_ConcurrencyCheck_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, ConcurrencyCheck) {
   static constexpr int THREADS = 10;
   static constexpr int EPOCH = 1000;
   static constexpr int KEY = 12345;

   auto Incr = [](Table *table) {
      auto exist_fn = [](typename Table::value_type &value) { value.second += 1; };
      auto emplace_fn = [](const typename Table::constructor &ctor) {
         ctor(KEY, 1);
      };
      for (int i = 0; i < EPOCH; ++i) {
         (void)table->lazy_emplace_l(KEY, exist_fn, emplace_fn);
      }
   };

   Table table;
   std::vector<std::thread> threads;
   threads.reserve(THREADS);
   for (int i = 0; i < THREADS; ++i) {
      threads.emplace_back([&]() { Incr(&table); });
   }

   for (auto &thread : threads) {
      thread.join();
   }

   EXPECT_EQ(table[KEY], 10000);
}